

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::CheckSignature(TypeChecker *this,TypeVector *sig,char *desc)

{
  Type expected;
  Result rhs;
  size_type sVar1;
  const_reference pvVar2;
  ulong local_30;
  size_t i;
  char *desc_local;
  TypeVector *sig_local;
  TypeChecker *this_local;
  Result result;
  
  Result::Result((Result *)((long)&this_local + 4),Ok);
  local_30 = 0;
  while( true ) {
    sVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(sig);
    if (sVar1 <= local_30) break;
    sVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(sig);
    pvVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[](sig,local_30);
    expected.enum_ = pvVar2->enum_;
    expected.type_index_ = pvVar2->type_index_;
    rhs = PeekAndCheckType(this,((int)sVar1 - (int)local_30) - 1,expected);
    Result::operator|=((Result *)((long)&this_local + 4),rhs);
    local_30 = local_30 + 1;
  }
  PrintStackIfFailedV(this,this_local._4_4_,desc,sig,false);
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::CheckSignature(const TypeVector& sig, const char* desc) {
  Result result = Result::Ok;
  for (size_t i = 0; i < sig.size(); ++i) {
    result |= PeekAndCheckType(sig.size() - i - 1, sig[i]);
  }
  PrintStackIfFailedV(result, desc, sig, /*is_end=*/false);
  return result;
}